

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.c
# Opt level: O2

void run_framework(void)

{
  ALLEGRO_FONT *font;
  FPS *fps;
  bool bVar1;
  bool bVar2;
  char cVar3;
  _Bool _Var4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  bool bVar9;
  byte bVar10;
  ulong uVar11;
  byte bVar12;
  GAMESTATE *to;
  bool bVar13;
  undefined8 in_XMM1_Qa;
  ALLEGRO_COLOR fg;
  ALLEGRO_EVENT event;
  
  (*state[current_state].init)();
  bVar10 = 0;
  transition = create_transition((GAMESTATE *)0x0,state + current_state,0.30000001192092896);
  timer = 0;
  bVar12 = 1;
  bVar2 = false;
  bVar1 = false;
  do {
    if (bVar10 != 0) {
      return;
    }
    al_wait_for_event(event_queue);
    switch(event.type) {
    case 0x1e:
      if (!bVar1) {
        timer = timer + 1;
        goto switchD_0010910b_caseD_2d;
      }
    case 0x2e:
      bVar1 = true;
      break;
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x2b:
    case 0x2c:
      break;
    case 0x29:
      al_acknowledge_resize(screen);
      screen_width = al_get_display_width(screen);
      uVar5 = al_get_display_height(screen);
      screen_height = uVar5;
      if (fullscreen == 0) {
        window_width = screen_width;
        piVar8 = &window_height;
LAB_001091f8:
        *piVar8 = uVar5;
      }
      break;
    case 0x2a:
      closed = 1;
      break;
    case 0x2d:
switchD_0010910b_caseD_2d:
      bVar1 = false;
      break;
    case 0x2f:
      if ((event.display.orientation == 8) || (event.display.orientation == 2)) {
        piVar8 = &screen_orientation;
        uVar5 = event.display.orientation;
        goto LAB_001091f8;
      }
      break;
    case 0x30:
      al_acknowledge_drawing_halt(screen);
      bVar2 = true;
      break;
    case 0x31:
      bVar2 = false;
      break;
    case 0x32:
    case 0x33:
switchD_0010910b_caseD_32:
      gamepad_event(&event);
      break;
    default:
      switch(event.type) {
      case 1:
      case 2:
      case 3:
        goto switchD_0010910b_caseD_32;
      case 10:
      case 0xb:
      case 0xc:
        keyboard_event(&event);
        break;
      case 0x14:
      case 0x15:
      case 0x16:
        mouse_handle_event(&event);
      }
    }
    cVar3 = al_is_event_queue_empty(event_queue);
    bVar10 = 0;
    if (cVar3 != '\0') {
      bVar13 = bVar12 != 1;
      while (bVar9 = 0 < timer, 0 < timer) {
        timer = timer + -1;
        _Var4 = key_pressed(0x3a);
        if (_Var4) {
          if (F12 == '\0') {
            F12 = '\x01';
            take_screenshot(screenshot);
          }
        }
        else {
          F12 = '\0';
        }
        if (transition == (TRANSITION *)0x0) {
          iVar6 = (*state[current_state].update)();
          if (iVar6 == -1) {
            bVar9 = false;
            transition = create_transition(state + current_state,(GAMESTATE *)0x0,
                                           0.30000001192092896);
            last_state = current_state;
            current_state = -1;
            break;
          }
          iVar7 = (*state[current_state].id)();
          if (iVar6 != iVar7) {
            last_state = current_state;
            to = state;
            uVar11 = 0;
            while( true ) {
              if ((state_count != '\x01') || (10 < uVar11)) goto LAB_0010935b;
              iVar7 = (*to->id)();
              if (iVar7 == iVar6) break;
              uVar11 = uVar11 + 1;
              to = to + 1;
            }
            (*to->init)();
            transition = create_transition(state + current_state,to,0.30000001192092896);
            current_state = (int)uVar11;
          }
        }
        else {
          iVar6 = update_transition(transition);
          if (iVar6 == 0) {
            destroy_transition(transition);
            transition = (TRANSITION *)0x0;
            if (state[last_state].deinit != (_func_void *)0x0) {
              (*state[last_state].deinit)();
            }
            if (current_state == -1) break;
          }
        }
LAB_0010935b:
        fps_tick(::fps);
        keyboard_tick();
        mouse_tick();
        bVar13 = false;
      }
      if (bVar13 || bVar2) {
        bVar12 = ~bVar13;
      }
      else {
        if (transition == (TRANSITION *)0x0) {
          if ((long)current_state != -1) {
            (*state[current_state].draw)();
          }
        }
        else {
          draw_transition(transition);
        }
        fps = ::fps;
        iVar6 = screen_width;
        if (display_framerate != 0) {
          font = (ALLEGRO_FONT *)demo_data[1].dat;
          fg._0_8_ = al_map_rgb(0xff,0xff,0xff);
          fg.b = (float)(int)in_XMM1_Qa;
          fg.a = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
          draw_fps(fps,font,iVar6,0,fg,"%d FPS");
        }
        al_flip_display();
        fps_frame(::fps);
        bVar12 = 0;
      }
      bVar10 = bVar9 | closed & 1;
    }
  } while( true );
}

Assistant:

void run_framework(void)
{
   int done = false;            /* will become true when we're ready to close */
   int need_to_redraw = 1;      /* do we need to draw the next frame? */
   int next_state = current_state;
   int i;
   bool background_mode = false;
   bool paused = false;

   /* Initialize the first game screen. */
   state[current_state].init();

   /* Create a transition animation so that the first screen doesn't just
      pop up but comes in a nice animation that lasts 0.3 seconds. */
   transition = create_transition(NULL, &state[current_state], 0.3f);

   timer = 0;

   /* Do the main loop; until we're not done. */
   while (!done) {

      ALLEGRO_EVENT event;

      al_wait_for_event(event_queue, &event);
      switch (event.type) {
         
         case ALLEGRO_EVENT_MOUSE_AXES:
            mouse_handle_event(&event);
            break;
         
         case ALLEGRO_EVENT_MOUSE_BUTTON_DOWN:
            mouse_handle_event(&event);
            break;
         
         case ALLEGRO_EVENT_MOUSE_BUTTON_UP:
            mouse_handle_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_DOWN:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_CHAR:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_KEY_UP:
            keyboard_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_BUTTON_DOWN:
            gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_BUTTON_UP:
            gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_JOYSTICK_AXIS:
            gamepad_event(&event);
            break;
        
         case ALLEGRO_EVENT_TOUCH_BEGIN:
            gamepad_event(&event);
            break;
         case ALLEGRO_EVENT_TOUCH_END:
              gamepad_event(&event);
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            closed = true;
            break;
        
         case ALLEGRO_EVENT_TIMER:
            if (!paused)
               timer++;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_ORIENTATION:
            if (event.display.orientation == ALLEGRO_DISPLAY_ORIENTATION_90_DEGREES ||
                event.display.orientation == ALLEGRO_DISPLAY_ORIENTATION_270_DEGREES)
               screen_orientation = event.display.orientation;
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(screen);
            screen_width = al_get_display_width(screen);
            screen_height = al_get_display_height(screen);
            if (fullscreen == 0) {
               window_width = screen_width;
               window_height = screen_height;
            }
            break;
         
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background_mode = true;
            al_acknowledge_drawing_halt(screen);
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background_mode = false;
            break;
            
         case ALLEGRO_EVENT_DISPLAY_SWITCH_OUT:
            paused = true;
            break;
            
         case ALLEGRO_EVENT_DISPLAY_SWITCH_IN:
            paused = false;
            break;
            
      }
      
      if (!al_is_event_queue_empty(event_queue)) continue;

      /* Check if the timer has ticked. */
      while (timer > 0) {
         --timer;

         /* See if the user pressed F12 to see if the user wants to take
            a screenshot. */
         if (key_pressed(ALLEGRO_KEY_F12)) {
            /* See if the F12 key was already pressed before. */
            if (F12 == 0) {
               /* The user just pressed F12 (it wasn't pressed before), so
                  remember this and take a screenshot! */
               F12 = 1;
               take_screenshot(screenshot);
            }
         } else {
            /* Remember for later that F12 is not pressed. */
            F12 = 0;
         }

         /* Do one frame of logic. If we're in between states, then update
            the transition animation module, otherwise update the current
            game state. */
         if (transition) {
            /* Advance the transition animation. If it returns non-zero, it
               means the animation finished playing. */
            if (update_transition(transition) == 0) {
               /* Destroy the animation, we're done with it. */
               destroy_transition(transition);
               transition = NULL;

               /* Complete the transition to the new state by deiniting the
                  previous one. */
               if (state[last_state].deinit) {
                  state[last_state].deinit();
               }

               /* Stop the main loop if there is no more game screens. */
               if (current_state == DEMO_STATE_EXIT) {
                  done = true;
                  break;
               }
            }
         }
         /* We're not in between states, so update the current one. */
         else {
            /* Update the current state. It returns the ID of the
               next state. */

            next_state = state[current_state].update();

            /* Did the current state just close the game? */
            if (next_state == DEMO_STATE_EXIT) {
               /* Create a transition so the game doesn't just close but
                  instead goes out in a nice animation. */
               transition =
                  create_transition(&state[current_state], NULL, 0.3f);
               last_state = current_state;
               current_state = next_state;
               break;
            }
            /* If the next state is different then the current one, then
               start a transition. */
            else if (next_state != state[current_state].id()) {
               last_state = current_state;

               /* Find the index of the next state in the state array.
                  Note that ID of a state is not the same as its index in
                  the array! */
               for (i = 0; i < state_count; i++) {
                  /* Did we find it? */
                  if (state[i].id() == next_state) {
                     /* We found the new state. Initialize it and start the
                        transition animation. */
                     state[i].init();
                     transition =
                        create_transition(&state[current_state], &state[i],
                                          0.3f);
                     current_state = i;
                     break;
                  }
               }
            }
         }

         /* We just did one logic frame so we assume we will need to update
            the visuals to reflect the changes this logic frame made. */
         need_to_redraw = 1;

         /* Let the framerate counter know that one logic frame was run. */
         fps_tick(fps);

         keyboard_tick();
         mouse_tick();
      }

      /* In case a frame of logic has just been run or the user wants
         unlimited framerate, we must redraw the screen. */
      if (need_to_redraw == 1 && !background_mode) {
         /* Actually do the drawing. */
         draw_framework();

         /* Make sure we don't draw too many times. */
         need_to_redraw = 0;

         /* Let the framerate counter know that we just drew a frame. */
         fps_frame(fps);
      }

      /* Check if the user pressed the close icon. */
      done = done || closed;

   }
}